

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_device_sink_info_callback
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,int endOfList,void *pUserData)

{
  if (0 < endOfList) {
    return;
  }
  if (pUserData != (void *)0x0) {
    memcpy(pUserData,pInfo,0x1a0);
    return;
  }
  __assert_fail("pInfoOut != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x4bb6,
                "void ma_device_sink_info_callback(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
               );
}

Assistant:

void ma_device_sink_info_callback(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_pa_sink_info* pInfoOut;

    if (endOfList > 0) {
        return;
    }

    pInfoOut = (ma_pa_sink_info*)pUserData;
    MA_ASSERT(pInfoOut != NULL);

    *pInfoOut = *pInfo;

    (void)pPulseContext; /* Unused. */
}